

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ukf.cpp
# Opt level: O3

void __thiscall UKF::UKF(UKF *this)

{
  long size;
  int iVar1;
  double *pdVar2;
  DenseIndex DVar3;
  DenseIndex DVar4;
  DenseStorage<double,__1,__1,__1,_0> local_38;
  
  this->_vptr_UKF = (_func_int **)&PTR__UKF_00126d30;
  (this->weights_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  (this->weights_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       0;
  (this->x_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  (this->x_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  (this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  (this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0;
  (this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 0;
  (this->Xsig_pred_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_data = (double *)0x0;
  (this->Xsig_pred_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_rows = 0;
  (this->Xsig_pred_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_cols = 0;
  this->use_laser_ = true;
  this->use_radar_ = true;
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
            ((DenseStorage<double,__1,__1,_1,_0> *)&local_38,5,5,1);
  pdVar2 = (this->x_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_data;
  (this->x_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       local_38.m_data;
  DVar3 = (this->x_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
  ;
  (this->x_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       local_38.m_rows;
  local_38.m_data = pdVar2;
  local_38.m_rows = DVar3;
  free(pdVar2);
  local_38.m_data = (double *)0x0;
  local_38.m_rows = 0;
  local_38.m_cols = 0;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_38,0x19,5,5);
  pdVar2 = (this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_data;
  (this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       local_38.m_data;
  DVar3 = (this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_rows;
  DVar4 = (this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_cols;
  (this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
       local_38.m_rows;
  (this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       local_38.m_cols;
  local_38.m_data = pdVar2;
  local_38.m_rows = DVar3;
  local_38.m_cols = DVar4;
  free(pdVar2);
  this->std_a_ = 2.0;
  this->std_yawdd_ = 0.3;
  this->std_laspx_ = 0.15;
  this->std_laspy_ = 0.15;
  this->std_radr_ = 0.3;
  this->std_radphi_ = 0.03;
  this->std_radrd_ = 0.3;
  this->is_initialized_ = false;
  this->time_us_ = 0;
  this->n_x_ = 5;
  this->n_aug_ = 7;
  this->lambda_ = -2.0;
  local_38.m_cols = 0;
  local_38.m_data = (double *)0x0;
  local_38.m_rows = 0;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_38,0x4b,5,0xf);
  pdVar2 = (this->Xsig_pred_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
           m_storage.m_data;
  (this->Xsig_pred_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_data = local_38.m_data;
  DVar3 = (this->Xsig_pred_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
          m_storage.m_rows;
  DVar4 = (this->Xsig_pred_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
          m_storage.m_cols;
  (this->Xsig_pred_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_rows = local_38.m_rows;
  (this->Xsig_pred_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_cols = local_38.m_cols;
  local_38.m_data = pdVar2;
  local_38.m_rows = DVar3;
  local_38.m_cols = DVar4;
  free(pdVar2);
  iVar1 = this->n_aug_;
  size = (long)iVar1 * 2 + 1;
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
            ((DenseStorage<double,__1,__1,_1,_0> *)&local_38,size,size,1);
  if (-1 < iVar1) {
    pdVar2 = (this->weights_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_data;
    (this->weights_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
         = local_38.m_data;
    DVar3 = (this->weights_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
            m_storage.m_rows;
    (this->weights_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
         = local_38.m_rows;
    local_38.m_data = pdVar2;
    local_38.m_rows = DVar3;
    free(pdVar2);
    this->NIS_radar_ = 0.0;
    this->NIS_laser_ = 0.0;
    return;
  }
  __assert_fail("dim >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/jeremy-shannon[P]CarND-Unscented-Kalman-Filter-Project/src/Eigen/src/Core/Matrix.h"
                ,0xf0,
                "Eigen::Matrix<double, -1, 1>::Matrix(Index) [_Scalar = double, _Rows = -1, _Cols = 1, _Options = 0, _MaxRows = -1, _MaxCols = 1]"
               );
}

Assistant:

UKF::UKF() {
  // if this is false, laser measurements will be ignored (except during init)
  use_laser_ = true;

  // if this is false, radar measurements will be ignored (except during init)
  use_radar_ = true;

  // initial state vector
  x_ = VectorXd(5);

  // initial covariance matrix
  P_ = MatrixXd(5, 5);

  // Process noise standard deviation longitudinal acceleration in m/s^2
  std_a_ = 2;

  // Process noise standard deviation yaw acceleration in rad/s^2
  std_yawdd_ = 0.3;

  // Laser measurement noise standard deviation position1 in m
  std_laspx_ = 0.15;

  // Laser measurement noise standard deviation position2 in m
  std_laspy_ = 0.15;

  // Radar measurement noise standard deviation radius in m
  std_radr_ = 0.3;

  // Radar measurement noise standard deviation angle in rad
  std_radphi_ = 0.03;

  // Radar measurement noise standard deviation radius change in m/s
  std_radrd_ = 0.3;

  /**
  TODO:
  Complete the initialization. See ukf.h for other member properties.
  Hint: one or more values initialized above might be wildly off...
  */

  // initially set to false, set to true in first call of ProcessMeasurement
  is_initialized_ = false;

  // time when the state is true, in us
  time_us_ = 0.0;

  // state dimension
  n_x_ = 5;

  // Augmented state dimension
  n_aug_ = 7;

  // Sigma point spreading parameter
  lambda_ = 3 - n_x_;

  // predicted sigma points matrix
  Xsig_pred_ = MatrixXd(n_x_, 2 * n_aug_ + 1);

  //create vector for weights
  weights_ = VectorXd(2 * n_aug_ + 1);

  // the current NIS for radar
  NIS_radar_ = 0.0;

  // the current NIS for laser
  NIS_laser_ = 0.0;
}